

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O1

void __thiscall
powerpc_test_cpu::test_one_1
          (powerpc_test_cpu *this,uint32_t *code,char *insn,uint32_t a1,uint32_t a2,uint32_t a3,
          uint32_t a0)

{
  uint32_t uVar1;
  uint32_t cr;
  uint32_t uVar2;
  uint32_t xer;
  uint32_t cr_00;
  uint32_t xer_00;
  char *pcVar3;
  
  uVar2 = get32(this);
  xer = get32(this);
  cr_00 = get32(this);
  PowerCore::setXER((PowerCore *)this,this->init_xer);
  (this->super_powerpc_cpu_base).super_PowerCore.super_PowerCoreState.cr = this->init_cr;
  (this->super_powerpc_cpu_base).super_PowerCore.super_PowerCoreState.r[3] = a0;
  (this->super_powerpc_cpu_base).super_PowerCore.super_PowerCoreState.r[4] = a1;
  (this->super_powerpc_cpu_base).super_PowerCore.super_PowerCoreState.r[5] = a2;
  execute(this,code);
  uVar1 = (this->super_powerpc_cpu_base).super_PowerCore.super_PowerCoreState.r[3];
  xer_00 = PowerCore::getXER((PowerCore *)this);
  cr = (this->super_powerpc_cpu_base).super_PowerCore.super_PowerCoreState.cr;
  this->tests = this->tests + 1;
  if (cr_00 == cr && (xer == xer_00 && uVar2 == uVar1)) {
    return;
  }
  printf("FAIL: %s [%08x]\n",insn,(ulong)code[*code == 0x7c802378]);
  this->errors = this->errors + 1;
  pcVar3 = " %08x, %08x, %08x, %08x => %08x [";
  printf(" %08x, %08x, %08x, %08x => %08x [",(ulong)a0,(ulong)a1,(ulong)a2,(ulong)a3,(ulong)uVar2);
  print_flags((powerpc_test_cpu *)pcVar3,cr_00,xer,0);
  puts("]");
  pcVar3 = " %08x, %08x, %08x, %08x => %08x [";
  printf(" %08x, %08x, %08x, %08x => %08x [",(ulong)a0,(ulong)a1,(ulong)a2,(ulong)a3,uVar1);
  print_flags((powerpc_test_cpu *)pcVar3,cr,xer_00,0);
  puts("]");
  return;
}

Assistant:

void powerpc_test_cpu::test_one_1(uint32_t *code, const char *insn, uint32_t a1, uint32_t a2, uint32_t a3, uint32_t a0)
{
#ifdef NATIVE_POWERPC
	// Invoke native code
	const uint32_t save_xer = native_get_xer();
	const uint32_t save_cr = native_get_cr();
	native_set_xer(init_xer);
	native_set_cr(init_cr);
	typedef uint32_t (*func_t)(uint32_t, uint32_t, uint32_t);
	func_t func = (func_t)code;
	const uint32_t native_rd = func(a0, a1, a2);
	const uint32_t native_xer = native_get_xer();
	const uint32_t native_cr = native_get_cr();
	native_set_xer(save_xer);
	native_set_cr(save_cr);
	if (results_file) {
		put32(native_rd);
		put32(native_xer);
		put32(native_cr);
	}
#else
	const uint32_t native_rd = get32();
	const uint32_t native_xer = get32();
	const uint32_t native_cr = get32();
#endif
#ifndef NO_EMU
	if (SKIP_ALU_OPS)
		return;

	// Invoke emulated code
	emul_set_xer(init_xer);
	emul_set_cr(init_cr);
	set_gpr(RD, a0);
	set_gpr(RA, a1);
	set_gpr(RB, a2);
	execute(code);
	const uint32_t emul_rd = get_gpr(RD);
	const uint32_t emul_xer = emul_get_xer();
	const uint32_t emul_cr = emul_get_cr();
	
	++tests;

	bool ok = native_rd == emul_rd
		&& native_xer == emul_xer
		&& native_cr == emul_cr;

	if (code[0] == POWERPC_MR(0, RA))
		code++;

	if (!ok) {
		printf("FAIL: %s [%08x]\n", insn, code[0]);
		errors++;
	}
	else if (verbose) {
		printf("PASS: %s [%08x]\n", insn, code[0]);
	}

	if (!ok || verbose) {
#if ENABLE_MON
		disass_ppc(stdout, (uintptr_t)code, code[0]);
#endif
#define PRINT_OPERANDS(PREFIX) do {						\
			printf(" %08x, %08x, %08x, %08x => %08x [",	\
				   a0, a1, a2, a3, PREFIX##_rd);		\
			print_flags(PREFIX##_cr, PREFIX##_xer);		\
			printf("]\n");								\
		} while (0)
		PRINT_OPERANDS(native);
		PRINT_OPERANDS(emul);
#undef  PRINT_OPERANDS
	}
#endif
}